

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

void begin_quest_checksum(dw_rom *rom,uint64_t crc)

{
  char local_25 [8];
  char crc_text [13];
  uint64_t crc_local;
  dw_rom *rom_local;
  
  builtin_strncpy(local_25," CRC: XX",8);
  builtin_strncpy(crc_text,"XXXX",5);
  crc_text._5_8_ = crc;
  snprintf(local_25 + 6,7,"%016lX",crc);
  vpatch(rom,0x6f8e,2,0xec,199);
  vpatch(rom,0xc7ec,7,0x81,2,0x18,0x12,0,0x21,0x8d);
  set_text(rom,0xc7f3,local_25);
  vpatch(rom,0xc800,0x15,0x88,0x81,0x25,0x28,0x2a,0x2c,0x31,0x81,0x24,0x81,0x31,0x28,0x3a,0x81,0x34,
         0x38,0x28,0x36,0x37,0x80);
  return;
}

Assistant:

static void begin_quest_checksum(dw_rom *rom, uint64_t crc)
{

    char crc_text[] = " CRC: XXXXXX";

    // This grabs the checksum
    snprintf(crc_text+6, 7, "%016"PRIX64, crc);

    //replaces the "begin new quest" window data address
    //the old address was 0x72a8. the new address is 0xc7ec.
    vpatch(rom, 0x6f8e, 2, 0xec, 0xc7);

    //our brand new "begin new quest" window
    vpatch(rom, 0xc7ec, 7,  
        0x81, //Window Options.  Selection window. 
        0x02, //Window Height.   2 blocks.
        0x18, //Window Width.    24 tiles.
        0x12, //Window Position. Y = 1 blocks, X = 2 blocks.
        0x00, //Window columns.  1 column.
        0x21, //Cursor home.     Y = 2 tiles, X = 1 tiles.
        0x8d  //Horizontal border, 5 spaces.
    );

    //Continues from above and fills out the checksum in the window
    set_text(rom, 0xc7f3, crc_text);

    //Continues after the checksum and fills in the remainder of window data.
    vpatch(rom, 0xc800, 21,
        0x88, //Horizontal border, remainder of row. (still checksum row)
        // " BEGIN A NEW QUEST"
        0x81, 0x25, 0x28, 0x2A, 0x2C, 0x31, 0x81, 0x24,
        0x81, 0x31, 0x28, 0x3a, 0x81, 0x34, 0x38, 0x28,
        0x36, 0x37,
        0x80 //Blank Space, remainder of row.
    );
}